

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O2

ULONG PAL_strtoul(char *szNumber,char **pszEnd,int nBase)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  int *piVar4;
  char *pcVar5;
  
  if (PAL_InitializeChakraCoreCalled) {
    uVar3 = strtoul(szNumber,pszEnd,nBase);
    pcVar5 = szNumber;
    if (uVar3 >> 0x20 != 0) {
      do {
        cVar1 = *szNumber;
        iVar2 = isspace((int)cVar1);
        szNumber = pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (iVar2 != 0);
      if (cVar1 != '-') {
        piVar4 = __errno_location();
        *piVar4 = 0x22;
        uVar3 = 0xffffffff;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (ULONG)uVar3;
    }
  }
  abort();
}

Assistant:

ULONG
__cdecl
PAL_strtoul(const char *szNumber, char **pszEnd, int nBase)
{
    unsigned long ulResult;

    PERF_ENTRY(strtoul);
    ENTRY("strtoul (szNumber=%p (%s), pszEnd=%p, nBase=%d)\n",
        szNumber?szNumber:"NULL",
        szNumber?szNumber:"NULL",
        pszEnd,
        nBase);

    ulResult = strtoul(szNumber, pszEnd, nBase);

#ifdef BIT64
    if (ulResult > _UI32_MAX)
    {
        char ch = *szNumber;
        while (isspace(ch))
        {
	    ch = *szNumber++;
        }
        /* If the string represents a positive number that is greater than
            _UI32_MAX, set errno to ERANGE. Otherwise, don't set errno
            to match Windows behavior. */
        if (ch != '-')
        {
            ulResult = _UI32_MAX;
            errno = ERANGE;
        }
    }
#endif

    LOGEXIT("strtoul returning unsigned long %lu\n", ulResult);
    PERF_EXIT(wcstoul);

    /* When returning unsigned long res from this function, it will be
        implicitly cast to ULONG. This handles situations where a string that
        represents a negative number is passed in to strtoul. The Windows
        behavior is analogous to taking the binary equivalent of the negative
        value and treating it as a positive number. Returning a ULONG from
        this function, as opposed to native unsigned long, allows us to match
        this behavior. The explicit cast to ULONG below is used to silence any
        potential warnings due to the implicit casting.  */
    return (ULONG)ulResult;

}